

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O3

char * getoffset(char *strp,int_fast32_t *offsetp)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  
  cVar1 = *strp;
  bVar2 = strp[(cVar1 - 0x2bU & 0xfd) == 0];
  if (bVar2 - 0x30 < 10) {
    iVar5 = 0;
    pbVar3 = (byte *)(strp + ((cVar1 - 0x2bU & 0xfd) == 0));
    do {
      pbVar4 = pbVar3;
      iVar5 = (int)(char)bVar2 + iVar5 * 10 + -0x30;
      if (0xa7 < iVar5) {
        return (char *)0x0;
      }
      bVar2 = pbVar4[1];
      pbVar3 = pbVar4 + 1;
    } while (bVar2 - 0x30 < 10);
    if (-1 < iVar5) {
      iVar5 = iVar5 * 0xe10;
      *offsetp = iVar5;
      if (*pbVar3 != 0x3a) goto LAB_001052b2;
      bVar2 = pbVar4[2];
      if (bVar2 - 0x30 < 10) {
        iVar6 = 0;
        pbVar4 = pbVar4 + 3;
        do {
          pbVar3 = pbVar4;
          iVar6 = (int)(char)bVar2 + iVar6 * 10 + -0x30;
          if (0x3b < iVar6) {
            return (char *)0x0;
          }
          bVar2 = *pbVar3;
          pbVar4 = pbVar3 + 1;
        } while (bVar2 - 0x30 < 10);
        if (-1 < iVar6) {
          iVar5 = iVar5 + iVar6 * 0x3c;
          *offsetp = iVar5;
          if (*pbVar3 != 0x3a) {
LAB_001052b2:
            if (cVar1 == '-') {
              *offsetp = -iVar5;
              return (char *)pbVar3;
            }
            return (char *)pbVar3;
          }
          bVar2 = *pbVar4;
          if (bVar2 - 0x30 < 10) {
            iVar6 = 0;
            do {
              iVar6 = (int)(char)bVar2 + iVar6 * 10 + -0x30;
              if (0x3c < iVar6) {
                return (char *)0x0;
              }
              bVar2 = pbVar4[1];
              pbVar4 = pbVar4 + 1;
            } while (bVar2 - 0x30 < 10);
            if (-1 < iVar6) {
              iVar5 = iVar6 + iVar5;
              *offsetp = iVar5;
              pbVar3 = pbVar4;
              goto LAB_001052b2;
            }
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char * getoffset( const char * strp, int_fast32_t * offsetp )
{
    bool neg = false;

    if ( *strp == '-' )
    {
        neg = true;
        ++strp;
    }
    else if ( *strp == '+' )
    {
        ++strp;
    }

    strp = getsecs( strp, offsetp );

    if ( strp == NULL )
    {
        return NULL;        /* illegal time */
    }

    if ( neg )
    {
        *offsetp = - *offsetp;
    }

    return strp;
}